

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,int64_t value)

{
  ScriptOperator *this_00;
  pointer puVar1;
  long lVar2;
  long lVar3;
  ScriptType data_type;
  undefined1 local_78 [8];
  pointer puStack_70;
  _Alloc_hider local_68;
  uchar local_58 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_00740660;
  this->type_ = kElementNumber;
  this_00 = &this->op_code_;
  ScriptOperator::ScriptOperator(this_00,kOpInvalidOpCode);
  ByteData::ByteData(&this->binary_data_);
  this->value_ = value;
  if (0x11 < value + 1U) goto LAB_00313174;
  if (value == -1) {
    data_type = kOp1Negate;
  }
  else if (value < 1) {
    data_type = kOpFalse;
  }
  else {
    data_type = (int)value + kOpReserved;
  }
  if (g_operator_map._40_8_ == 0) {
LAB_0031311f:
    ScriptOperator::ScriptOperator((ScriptOperator *)local_78,data_type);
    if (this_00 != (ScriptOperator *)local_78) {
      (this->op_code_).data_type_ = (ScriptType)puStack_70;
      ::std::__cxx11::string::_M_assign((string *)&(this->op_code_).text_data_);
    }
    local_78 = (undefined1  [8])&PTR__ScriptOperator_00734d50;
    if ((uchar *)local_68._M_p != local_58) {
      operator_delete(local_68._M_p);
    }
  }
  else {
    lVar2 = 0x76a058;
    if (g_operator_map._16_8_ != 0) {
      lVar2 = 0x76a058;
      lVar3 = g_operator_map._16_8_;
      do {
        if ((int)data_type <= *(int *)(lVar3 + 0x20)) {
          lVar2 = lVar3;
        }
        lVar3 = *(long *)(lVar3 + 0x10 + (ulong)(*(int *)(lVar3 + 0x20) < (int)data_type) * 8);
      } while (lVar3 != 0);
    }
    lVar3 = 0x76a058;
    if ((lVar2 != 0x76a058) && (lVar3 = 0x76a058, *(int *)(lVar2 + 0x20) <= (int)data_type)) {
      lVar3 = lVar2;
    }
    if (lVar3 == 0x76a058) goto LAB_0031311f;
    if (this_00 != (ScriptOperator *)(lVar3 + 0x28)) {
      (this->op_code_).data_type_ = *(ScriptType *)(lVar3 + 0x30);
      ::std::__cxx11::string::_M_assign((string *)&(this->op_code_).text_data_);
    }
  }
  if ((this->op_code_).data_type_ != kOpInvalidOpCode) {
    this->type_ = kElementOpCode;
  }
LAB_00313174:
  if (this->type_ == kElementNumber) {
    SerializeScriptNum(&local_40,this->value_);
    ByteData::ByteData((ByteData *)local_78,&local_40);
    puVar1 = (this->binary_data_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->binary_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
    (this->binary_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_70;
    (this->binary_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_68._M_p;
    local_78 = (undefined1  [8])0x0;
    puStack_70 = (pointer)0x0;
    local_68._M_p = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78);
    }
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(int64_t value)
    : type_(kElementNumber),
      op_code_(kOpInvalidOpCode),
      binary_data_(),
      value_(value) {
  if ((value >= -1) && (value <= 16)) {
    int32_t op_code = static_cast<int32_t>(kOp_0);
    if (value == -1) {
      op_code = static_cast<int32_t>(kOp1Negate);

    } else if (value >= 1) {
      op_code = static_cast<int32_t>(kOp_1);
      op_code += static_cast<int32_t>(value) - 1;
    }

    ScriptType key = static_cast<ScriptType>(op_code);
    bool is_find = false;
    if (!g_operator_map.empty()) {
      decltype(g_operator_map)::const_iterator ite = g_operator_map.find(key);
      if (ite != g_operator_map.end()) {
        op_code_ = ite->second;
        is_find = true;
      }
    }
    if (!is_find) {
      op_code_ = ScriptOperator(key);
    }
    if (op_code_.GetDataType() != kOpInvalidOpCode) {
      type_ = kElementOpCode;
    }
  }

  if (type_ == kElementNumber) {
    // set binary data
    binary_data_ = ByteData(SerializeScriptNum(value_));
  }
}